

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_gc(lua_State *L,int what,...)

{
  lu_byte lVar1;
  global_State *g;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long debt;
  bool bVar6;
  va_list argp;
  uint local_c8;
  uint local_c0;
  int local_b8;
  
  g = L->l_G;
  if ((g->gcstp & 2) != 0) {
    return -1;
  }
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x56e,"int lua_gc(lua_State *, int, ...)");
  }
  uVar5 = 0xffffffff;
  switch(what) {
  case 0:
    g->gcstp = '\x01';
    goto LAB_0011183f;
  case 1:
    uVar5 = 0;
    luaE_setdebt(g,0);
    g->gcstp = '\0';
    break;
  case 2:
    uVar5 = 0;
    luaC_fullgc(L,0);
    break;
  case 3:
    uVar5 = (uint)((ulong)(g->GCdebt + g->totalbytes) >> 10);
    break;
  case 4:
    uVar5 = (int)g->GCdebt + (int)g->totalbytes & 0x3ff;
    break;
  case 5:
    lVar1 = g->gcstp;
    g->gcstp = '\0';
    if ((long)(int)local_c8 == 0) {
      luaE_setdebt(g,0);
      debt = 1;
LAB_00111820:
      luaC_step(L);
    }
    else {
      debt = (long)(int)local_c8 * 0x400 + g->GCdebt;
      luaE_setdebt(g,debt);
      if (0 < L->l_G->GCdebt) goto LAB_00111820;
    }
    g->gcstp = lVar1;
    if (0 < debt) {
      bVar6 = g->gcstate == '\b';
      goto LAB_00111839;
    }
LAB_0011183f:
    uVar5 = 0;
    break;
  case 6:
    uVar5 = (uint)g->gcpause << 2;
    uVar3 = local_c8 + 3;
    if (-1 < (int)local_c8) {
      uVar3 = local_c8;
    }
    g->gcpause = (lu_byte)(uVar3 >> 2);
    break;
  case 7:
    uVar5 = (uint)g->gcstepmul << 2;
    uVar3 = local_c8 + 3;
    if (-1 < (int)local_c8) {
      uVar3 = local_c8;
    }
    g->gcstepmul = (lu_byte)(uVar3 >> 2);
    break;
  case 9:
    bVar6 = g->gcstp == '\0';
LAB_00111839:
    uVar5 = (uint)bVar6;
    break;
  case 10:
    uVar5 = 10;
    if (g->gckind != '\x01') {
      uVar5 = (g->lastatomic == 0) + 10;
    }
    if (local_c8 != 0) {
      g->genminormul = (lu_byte)local_c8;
    }
    if (local_c0 != 0) {
      uVar3 = local_c0 + 3;
      if (-1 < (int)local_c0) {
        uVar3 = local_c0;
      }
      g->genmajormul = (lu_byte)(uVar3 >> 2);
    }
    iVar4 = 1;
    goto LAB_00111809;
  case 0xb:
    uVar5 = 10;
    if (g->gckind != '\x01') {
      uVar5 = (g->lastatomic == 0) + 10;
    }
    if (local_c8 != 0) {
      uVar3 = local_c8 + 3;
      if (-1 < (int)local_c8) {
        uVar3 = local_c8;
      }
      g->gcpause = (lu_byte)(uVar3 >> 2);
    }
    if (local_c0 != 0) {
      uVar3 = local_c0 + 3;
      if (-1 < (int)local_c0) {
        uVar3 = local_c0;
      }
      g->gcstepmul = (lu_byte)(uVar3 >> 2);
    }
    if (local_b8 != 0) {
      g->gcstepsize = (lu_byte)local_b8;
    }
    iVar4 = 0;
LAB_00111809:
    luaC_changemode(L,iVar4);
  }
  piVar2 = *(int **)&L[-1].hookmask;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    return uVar5;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x5c6,"int lua_gc(lua_State *, int, ...)");
}

Assistant:

LUA_API int lua_gc (lua_State *L, int what, ...) {
  va_list argp;
  int res = 0;
  global_State *g = G(L);
  if (g->gcstp & GCSTPGC)  /* internal stop? */
    return -1;  /* all options are invalid when stopped */
  lua_lock(L);
  va_start(argp, what);
  switch (what) {
    case LUA_GCSTOP: {
      g->gcstp = GCSTPUSR;  /* stopped by the user */
      break;
    }
    case LUA_GCRESTART: {
      luaE_setdebt(g, 0);
      g->gcstp = 0;  /* (GCSTPGC must be already zero here) */
      break;
    }
    case LUA_GCCOLLECT: {
      luaC_fullgc(L, 0);
      break;
    }
    case LUA_GCCOUNT: {
      /* GC values are expressed in Kbytes: #bytes/2^10 */
      res = cast_int(gettotalbytes(g) >> 10);
      break;
    }
    case LUA_GCCOUNTB: {
      res = cast_int(gettotalbytes(g) & 0x3ff);
      break;
    }
    case LUA_GCSTEP: {
      int data = va_arg(argp, int);
      l_mem debt = 1;  /* =1 to signal that it did an actual step */
      lu_byte oldstp = g->gcstp;
      g->gcstp = 0;  /* allow GC to run (GCSTPGC must be zero here) */
      if (data == 0) {
        luaE_setdebt(g, 0);  /* do a basic step */
        luaC_step(L);
      }
      else {  /* add 'data' to total debt */
        debt = cast(l_mem, data) * 1024 + g->GCdebt;
        luaE_setdebt(g, debt);
        luaC_checkGC(L);
      }
      g->gcstp = oldstp;  /* restore previous state */
      if (debt > 0 && g->gcstate == GCSpause)  /* end of cycle? */
        res = 1;  /* signal it */
      break;
    }
    case LUA_GCSETPAUSE: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcpause);
      setgcparam(g->gcpause, data);
      break;
    }
    case LUA_GCSETSTEPMUL: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcstepmul);
      setgcparam(g->gcstepmul, data);
      break;
    }
    case LUA_GCISRUNNING: {
      res = gcrunning(g);
      break;
    }
    case LUA_GCGEN: {
      int minormul = va_arg(argp, int);
      int majormul = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (minormul != 0)
        g->genminormul = minormul;
      if (majormul != 0)
        setgcparam(g->genmajormul, majormul);
      luaC_changemode(L, KGC_GEN);
      break;
    }
    case LUA_GCINC: {
      int pause = va_arg(argp, int);
      int stepmul = va_arg(argp, int);
      int stepsize = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (pause != 0)
        setgcparam(g->gcpause, pause);
      if (stepmul != 0)
        setgcparam(g->gcstepmul, stepmul);
      if (stepsize != 0)
        g->gcstepsize = stepsize;
      luaC_changemode(L, KGC_INC);
      break;
    }
    default: res = -1;  /* invalid option */
  }
  va_end(argp);
  lua_unlock(L);
  return res;
}